

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cpp
# Opt level: O0

void sznet::CurrentThread::cacheTid(void)

{
  int iVar1;
  long lVar2;
  long *in_FS_OFFSET;
  
  if (*(int *)(*in_FS_OFFSET + -0x30) == 0) {
    lVar2 = syscall(0xba);
    *(int *)(*in_FS_OFFSET + -0x30) = (int)lVar2;
    iVar1 = snprintf((char *)(*in_FS_OFFSET + -0x20),0x20,"%5d ",
                     (ulong)*(uint *)(*in_FS_OFFSET + -0x30));
    *(int *)(*in_FS_OFFSET + -0x290) = iVar1;
  }
  return;
}

Assistant:

void cacheTid()
{
	if (t_cachedTid == 0)
	{
#if defined(SZ_OS_WINDOWS)
		t_cachedTid = GetCurrentThreadId();
#else
		t_cachedTid = syscall(SYS_gettid);
#endif
		t_tidStringLength = snprintf(t_tidString, sizeof(t_tidString), "%5d ", t_cachedTid);
	}
}